

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QObject*,QPointer<QHttp2Stream>>::emplace<QPointer<QHttp2Stream>const&>
          (QHash<QObject*,QPointer<QHttp2Stream>> *this,QObject **key,QPointer<QHttp2Stream> *args)

{
  Data *pDVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *pDVar3;
  long in_FS_OFFSET;
  piter pVar4;
  QPointer<QHttp2Stream> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
LAB_001fcd4a:
    pDVar3 = *(Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> **)this;
    local_30.wp.d = pDVar1;
    if ((pDVar3 == (Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)0x0) ||
       (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar3 = QHashPrivate::Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_>::detached
                         (pDVar3);
      *(Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> **)this = pDVar3;
    }
    pVar4 = (piter)emplace_helper<QPointer<QHttp2Stream>const&>(this,key,args);
    QHash<QObject_*,_QPointer<QHttp2Stream>_>::~QHash
              ((QHash<QObject_*,_QPointer<QHttp2Stream>_> *)&local_30);
  }
  else {
    if (1 < (uint)(pDVar1->weakref)._q_value.super___atomic_base<int>._M_i) {
      if ((pDVar1 != (Data *)0x0) &&
         ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_001fcd4a;
    }
    uVar2._0_4_ = pDVar1[1].weakref;
    uVar2._4_4_ = pDVar1[1].strongref;
    if (pDVar1->destroyer < (DestroyerFn)(uVar2 >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar4 = (piter)emplace_helper<QPointer<QHttp2Stream>const&>(this,key,args);
        return (iterator)pVar4;
      }
      goto LAB_001fcdef;
    }
    local_30.wp.d = (args->wp).d;
    local_30.wp.value = (args->wp).value;
    if (local_30.wp.d != (Data *)0x0) {
      LOCK();
      ((local_30.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_30.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar4 = (piter)emplace_helper<QPointer<QHttp2Stream>>(this,key,&local_30);
    if (local_30.wp.d != (Data *)0x0) {
      LOCK();
      ((local_30.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_30.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((local_30.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
         (local_30.wp.d != (Data *)0x0)) {
        operator_delete(local_30.wp.d);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
LAB_001fcdef:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }